

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree-inl.hh
# Opt level: O1

bool __thiscall
phosg::KDTree<phosg::Vector2<long>,_long>::delete_node
          (KDTree<phosg::Vector2<long>,_long> *this,Node *n)

{
  anon_union_8_2_94730038_for_Vector2<long>_3 aVar1;
  Node *pNVar2;
  logic_error *this_00;
  bool bVar3;
  KDTree<phosg::Vector2<long>,_long> *pKVar4;
  size_t target_dim;
  
  bVar3 = true;
  do {
    pNVar2 = n->before;
    if (pNVar2 == (Node *)0x0) {
      if (n->after_or_equal == (Node *)0x0) {
        pNVar2 = n->parent;
        pKVar4 = this;
        if (pNVar2 != (Node *)0x0) {
          if (pNVar2->before == n) {
            pNVar2->before = (Node *)0x0;
          }
          if (pNVar2->after_or_equal != n) goto LAB_00108fa2;
          pKVar4 = (KDTree<phosg::Vector2<long>,_long> *)&pNVar2->after_or_equal;
        }
        pKVar4->root = (Node *)0x0;
LAB_00108fa2:
        this->node_count = this->node_count - 1;
        if (n != (Node *)0x0) {
          operator_delete(n,0x38);
        }
        return bVar3;
      }
      pNVar2 = n->after_or_equal;
      if (pNVar2 == (Node *)0x0) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        ::std::logic_error::logic_error(this_00,"node is a leaf but still claims to be movable");
        __cxa_throw(this_00,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
      }
      target_dim = n->dim;
      bVar3 = false;
    }
    else {
      target_dim = n->dim;
      bVar3 = true;
    }
    pNVar2 = find_subtree_min_max(this,pNVar2,target_dim,bVar3);
    aVar1 = (pNVar2->pt).field_1;
    (n->pt).field_0 = (pNVar2->pt).field_0;
    (n->pt).field_1 = aVar1;
    n->value = pNVar2->value;
    bVar3 = false;
    n = pNVar2;
  } while( true );
}

Assistant:

bool KDTree<CoordType, ValueType>::delete_node(Node* n) {
  // replace the node with an appropriate node from its subtree, repeating until
  // the node is a leaf node
  bool was_leaf_node = true;
  while (n->before || n->after_or_equal) {
    was_leaf_node = false;
    Node* target;
    if (n->before) {
      target = KDTree::find_subtree_min_max(n->before, n->dim, true);
    } else if (n->after_or_equal) {
      target = KDTree::find_subtree_min_max(n->after_or_equal, n->dim, false);
    } else {
      throw std::logic_error("node is a leaf but still claims to be movable");
    }
    n->pt = target->pt;
    n->value = std::move(target->value);
    n = target;
  }

  // unlink the node from its parent
  if (n->parent == nullptr) {
    this->root = nullptr;
  } else {
    if (n->parent->before == n) {
      n->parent->before = nullptr;
    }
    if (n->parent->after_or_equal == n) {
      n->parent->after_or_equal = nullptr;
    }
  }

  // delete the (now-leaf) node
  this->node_count--;
  delete n;

  return was_leaf_node;
}